

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O2

void cgltf_free(cgltf_data *data)

{
  void *pvVar1;
  cgltf_attribute *pcVar2;
  char **ppcVar3;
  cgltf_buffer *pcVar4;
  cgltf_mesh *pcVar5;
  cgltf_primitive *pcVar6;
  ulong uVar7;
  cgltf_size k_1;
  cgltf_size k;
  ulong uVar8;
  ulong uVar9;
  cgltf_size j;
  long lVar10;
  cgltf_size i;
  ulong uVar11;
  
  if (data != (cgltf_data *)0x0) {
    (*data->memory_free)(data->memory_user_data,(data->asset).copyright);
    (*data->memory_free)(data->memory_user_data,(data->asset).generator);
    (*data->memory_free)(data->memory_user_data,(data->asset).version);
    (*data->memory_free)(data->memory_user_data,(data->asset).min_version);
    (*data->memory_free)(data->memory_user_data,data->accessors);
    (*data->memory_free)(data->memory_user_data,data->buffer_views);
    lVar10 = 0;
    for (uVar11 = 0; uVar11 < data->buffers_count; uVar11 = uVar11 + 1) {
      pcVar4 = data->buffers;
      pvVar1 = *(void **)((long)&pcVar4->data + lVar10);
      if (pvVar1 != data->bin) {
        (*data->memory_free)(data->memory_user_data,pvVar1);
        pcVar4 = data->buffers;
      }
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&pcVar4->uri + lVar10));
      lVar10 = lVar10 + 0x28;
    }
    (*data->memory_free)(data->memory_user_data,data->buffers);
    uVar11 = 0;
    while( true ) {
      if (data->meshes_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,data->meshes[uVar11].name);
      for (uVar7 = 0; pcVar5 = data->meshes, uVar7 < pcVar5[uVar11].primitives_count;
          uVar7 = uVar7 + 1) {
        lVar10 = 0;
        uVar8 = 0;
        while( true ) {
          pcVar2 = pcVar5[uVar11].primitives[uVar7].attributes;
          if (pcVar5[uVar11].primitives[uVar7].attributes_count <= uVar8) break;
          (*data->memory_free)(data->memory_user_data,*(void **)((long)&pcVar2->name + lVar10));
          uVar8 = uVar8 + 1;
          pcVar5 = data->meshes;
          lVar10 = lVar10 + 0x18;
        }
        (*data->memory_free)(data->memory_user_data,pcVar2);
        for (uVar8 = 0; pcVar6 = data->meshes[uVar11].primitives,
            uVar8 < pcVar6[uVar7].targets_count; uVar8 = uVar8 + 1) {
          lVar10 = 0;
          uVar9 = 0;
          while( true ) {
            pcVar2 = pcVar6[uVar7].targets[uVar8].attributes;
            if (pcVar6[uVar7].targets[uVar8].attributes_count <= uVar9) break;
            (*data->memory_free)(data->memory_user_data,*(void **)((long)&pcVar2->name + lVar10));
            uVar9 = uVar9 + 1;
            pcVar6 = data->meshes[uVar11].primitives;
            lVar10 = lVar10 + 0x18;
          }
          (*data->memory_free)(data->memory_user_data,pcVar2);
        }
        (*data->memory_free)(data->memory_user_data,pcVar6[uVar7].targets);
      }
      (*data->memory_free)(data->memory_user_data,pcVar5[uVar11].primitives);
      (*data->memory_free)(data->memory_user_data,data->meshes[uVar11].weights);
      uVar7 = 0;
      while( true ) {
        ppcVar3 = data->meshes[uVar11].target_names;
        if (data->meshes[uVar11].target_names_count <= uVar7) break;
        (*data->memory_free)(data->memory_user_data,ppcVar3[uVar7]);
        uVar7 = uVar7 + 1;
      }
      (*data->memory_free)(data->memory_user_data,ppcVar3);
      uVar11 = uVar11 + 1;
    }
    (*data->memory_free)(data->memory_user_data,data->meshes);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->materials_count <= uVar11) break;
      (*data->memory_free)
                (data->memory_user_data,
                 *(void **)((long)(data->materials->pbr_metallic_roughness).base_color_texture.
                                  transform.offset + lVar10 + -0x24));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x248;
    }
    (*data->memory_free)(data->memory_user_data,data->materials);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->images_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->images->name + lVar10));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->images->uri + lVar10));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->images->mime_type + lVar10));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x30;
    }
    (*data->memory_free)(data->memory_user_data,data->images);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->textures_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->textures->name + lVar10));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x28;
    }
    (*data->memory_free)(data->memory_user_data,data->textures);
    (*data->memory_free)(data->memory_user_data,data->samplers);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->skins_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->skins->name + lVar10));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->skins->joints + lVar10));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x38;
    }
    (*data->memory_free)(data->memory_user_data,data->skins);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->cameras_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->cameras->name + lVar10));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x40;
    }
    (*data->memory_free)(data->memory_user_data,data->cameras);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->lights_count <= uVar11) break;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->lights->color + lVar10 + -8));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x28;
    }
    (*data->memory_free)(data->memory_user_data,data->lights);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->nodes_count <= uVar11) break;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar10 + -0x60))
      ;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar10 + -0x50))
      ;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)data->nodes->translation + lVar10 + -0x20))
      ;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0xd8;
    }
    (*data->memory_free)(data->memory_user_data,data->nodes);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->scenes_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->scenes->name + lVar10));
      (*data->memory_free)(data->memory_user_data,*(void **)((long)&data->scenes->nodes + lVar10));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x28;
    }
    (*data->memory_free)(data->memory_user_data,data->scenes);
    lVar10 = 0;
    uVar11 = 0;
    while( true ) {
      if (data->animations_count <= uVar11) break;
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->name + lVar10));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->samplers + lVar10));
      (*data->memory_free)
                (data->memory_user_data,*(void **)((long)&data->animations->channels + lVar10));
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x38;
    }
    (*data->memory_free)(data->memory_user_data,data->animations);
    uVar11 = 0;
    while( true ) {
      if (data->extensions_used_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,data->extensions_used[uVar11]);
      uVar11 = uVar11 + 1;
    }
    (*data->memory_free)(data->memory_user_data,data->extensions_used);
    uVar11 = 0;
    while( true ) {
      if (data->extensions_required_count <= uVar11) break;
      (*data->memory_free)(data->memory_user_data,data->extensions_required[uVar11]);
      uVar11 = uVar11 + 1;
    }
    (*data->memory_free)(data->memory_user_data,data->extensions_required);
    (*data->memory_free)(data->memory_user_data,data->file_data);
    (*data->memory_free)(data->memory_user_data,data);
    return;
  }
  return;
}

Assistant:

void cgltf_free(cgltf_data* data)
{
    if (!data)
    {
        return;
    }

    data->memory_free(data->memory_user_data, data->asset.copyright);
    data->memory_free(data->memory_user_data, data->asset.generator);
    data->memory_free(data->memory_user_data, data->asset.version);
    data->memory_free(data->memory_user_data, data->asset.min_version);

    data->memory_free(data->memory_user_data, data->accessors);
    data->memory_free(data->memory_user_data, data->buffer_views);

    for (cgltf_size i = 0; i < data->buffers_count; ++i)
    {
        if (data->buffers[i].data != data->bin)
        {
            data->memory_free(data->memory_user_data, data->buffers[i].data);
        }

        data->memory_free(data->memory_user_data, data->buffers[i].uri);
    }

    data->memory_free(data->memory_user_data, data->buffers);

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->meshes[i].name);

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
            {
                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes[k].name);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].attributes);

            for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
            {
                for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                {
                    data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes[m].name);
                }

                data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets[k].attributes);
            }

            data->memory_free(data->memory_user_data, data->meshes[i].primitives[j].targets);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].primitives);
        data->memory_free(data->memory_user_data, data->meshes[i].weights);

        for (cgltf_size j = 0; j < data->meshes[i].target_names_count; ++j)
        {
            data->memory_free(data->memory_user_data, data->meshes[i].target_names[j]);
        }

        data->memory_free(data->memory_user_data, data->meshes[i].target_names);
    }

    data->memory_free(data->memory_user_data, data->meshes);

    for (cgltf_size i = 0; i < data->materials_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->materials[i].name);
    }

    data->memory_free(data->memory_user_data, data->materials);

    for (cgltf_size i = 0; i < data->images_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->images[i].name);
        data->memory_free(data->memory_user_data, data->images[i].uri);
        data->memory_free(data->memory_user_data, data->images[i].mime_type);
    }

    data->memory_free(data->memory_user_data, data->images);

    for (cgltf_size i = 0; i < data->textures_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->textures[i].name);
    }

    data->memory_free(data->memory_user_data, data->textures);

    data->memory_free(data->memory_user_data, data->samplers);

    for (cgltf_size i = 0; i < data->skins_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->skins[i].name);
        data->memory_free(data->memory_user_data, data->skins[i].joints);
    }

    data->memory_free(data->memory_user_data, data->skins);

    for (cgltf_size i = 0; i < data->cameras_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->cameras[i].name);
    }

    data->memory_free(data->memory_user_data, data->cameras);

    for (cgltf_size i = 0; i < data->lights_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->lights[i].name);
    }

    data->memory_free(data->memory_user_data, data->lights);

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->nodes[i].name);
        data->memory_free(data->memory_user_data, data->nodes[i].children);
        data->memory_free(data->memory_user_data, data->nodes[i].weights);
    }

    data->memory_free(data->memory_user_data, data->nodes);

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->scenes[i].name);
        data->memory_free(data->memory_user_data, data->scenes[i].nodes);
    }

    data->memory_free(data->memory_user_data, data->scenes);

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->animations[i].name);
        data->memory_free(data->memory_user_data, data->animations[i].samplers);
        data->memory_free(data->memory_user_data, data->animations[i].channels);
    }

    data->memory_free(data->memory_user_data, data->animations);

    for (cgltf_size i = 0; i < data->extensions_used_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_used[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_used);

    for (cgltf_size i = 0; i < data->extensions_required_count; ++i)
    {
        data->memory_free(data->memory_user_data, data->extensions_required[i]);
    }

    data->memory_free(data->memory_user_data, data->extensions_required);

    data->memory_free(data->memory_user_data, data->file_data);

    data->memory_free(data->memory_user_data, data);
}